

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

flatcc_builder_ref_t
flatcc_builder_embed_buffer
          (flatcc_builder_t *B,uint16_t block_align,void *data,size_t size,uint16_t align,
          flatcc_builder_buffer_flags_t flags)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  flatbuffers_uoffset_t size_field;
  flatcc_iov_state_t iov;
  int local_c8;
  ushort local_c2;
  size_t local_c0;
  uint local_b8;
  flatcc_iovec_t local_b0 [8];
  
  local_c2 = align;
  align_buffer_end(B,&local_c2,block_align,(uint)(B->nest_id != 0));
  iVar4 = B->emit_start;
  uVar1 = local_c2 - 1 & iVar4 - ((int)size + (flags & 2) * 2);
  local_c8 = uVar1 + (int)size;
  local_c0 = 0;
  bVar6 = B->nest_id == 0;
  if (bVar6) {
    sVar5 = 0;
  }
  else {
    sVar5 = 4;
    local_c0 = 4;
    local_b0[0].iov_len = 4;
    local_b0[0].iov_base = &local_c8;
  }
  local_b8 = (uint)!bVar6;
  bVar6 = !bVar6;
  uVar3 = (uint)bVar6;
  if (size != 0) {
    sVar5 = sVar5 + size;
    local_b0[bVar6].iov_base = data;
    local_b0[bVar6].iov_len = size;
    uVar3 = uVar3 + 1;
    local_c0 = sVar5;
    local_b8 = uVar3;
  }
  if (uVar1 != 0) {
    sVar5 = sVar5 + uVar1;
    *(uint8_t **)((long)&local_b0[0].iov_base + (ulong)(uVar3 << 4)) = "";
    *(ulong *)((long)&local_b0[0].iov_len + (ulong)(uVar3 << 4)) = (ulong)uVar1;
    uVar3 = uVar3 + 1;
    local_c0 = sVar5;
    local_b8 = uVar3;
  }
  if ((sVar5 >> 4 < 0x10000001) && (0 < (int)sVar5)) {
    iVar4 = iVar4 - (int)sVar5;
    iVar2 = (*B->emit)(B->emit_context,local_b0,uVar3,iVar4,sVar5);
    if (iVar2 == 0) {
      B->emit_start = iVar4;
      return iVar4;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x299,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)"
                 );
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x295,"flatcc_builder_ref_t emit_front(flatcc_builder_t *, flatcc_iov_state_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_embed_buffer(flatcc_builder_t *B,
        uint16_t block_align,
        const void *data, size_t size, uint16_t align, flatcc_builder_buffer_flags_t flags)
{
    uoffset_t size_field, pad;
    iov_state_t iov;
    int with_size = (flags & flatcc_builder_with_size) != 0;

    if (align_buffer_end(B, &align, block_align, !is_top_buffer(B))) {
        return 0;
    }
    pad = front_pad(B, (uoffset_t)(size + (with_size ? field_size : 0)), align);
    write_uoffset(&size_field, (uoffset_t)size + pad);
    init_iov();
    /* Add ubyte vector size header if nested buffer. */
    push_iov_cond(&size_field, field_size, !is_top_buffer(B));
    push_iov(data, size);
    push_iov(_pad, pad);
    return emit_front(B, &iov);
}